

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# windows.c
# Opt level: O2

void curses_display_buffer(char *inbuf,nh_bool trymove)

{
  nh_menuitem_conflict *pnVar1;
  char cVar2;
  char *__ptr;
  nh_menuitem_conflict *items;
  char *pcVar3;
  char *pcVar4;
  size_t sVar5;
  uint uVar6;
  ulong uVar7;
  char *__s;
  int iVar8;
  char *pcVar9;
  long lVar10;
  int local_25c;
  char linebuf [256];
  char local_138 [264];
  
  __ptr = strdup(inbuf);
  items = (nh_menuitem_conflict *)malloc(0xa78);
  lVar10 = 0;
  local_25c = 10;
  __s = __ptr;
LAB_0011719f:
  if (*__s == '\0') {
    curses_display_menu(items,(wchar_t)lVar10,(char *)0x0,L'\0',(wchar_t *)0x0);
    free(items);
    free(__ptr);
    return;
  }
  pcVar3 = strchr(__s,10);
  if (pcVar3 != (char *)0x0) {
    if ((__s < pcVar3) && (pcVar3[-1] == '\r')) {
      pcVar3[-1] = '\0';
    }
    *pcVar3 = '\0';
  }
  strncpy(linebuf,__s,0x100);
  linebuf[0xff] = '\0';
  pcVar4 = strchr(linebuf,9);
  if ((pcVar4 != (char *)0x0) && (linebuf[0] != '\0')) {
    iVar8 = 0;
    pcVar9 = linebuf;
    pcVar4 = local_138;
    cVar2 = linebuf[0];
    do {
      pcVar9 = pcVar9 + 1;
      if (cVar2 == '\t') {
        uVar6 = (uint)(byte)((byte)iVar8 ^ 7);
        uVar7 = (ulong)(uVar6 & 7);
        memset(pcVar4,0x20,uVar7 + 1);
        pcVar4 = pcVar4 + uVar7;
        iVar8 = iVar8 + (uVar6 & 7);
      }
      else {
        if (cVar2 == '\0') goto LAB_00117274;
        *pcVar4 = cVar2;
      }
      iVar8 = iVar8 + 1;
      pcVar4 = pcVar4 + 1;
      cVar2 = *pcVar9;
    } while( true );
  }
  goto LAB_0011729b;
LAB_00117274:
  *pcVar4 = '\0';
  strcpy(linebuf,local_138);
LAB_0011729b:
  if (local_25c <= lVar10) {
    local_25c = local_25c * 2;
    items = (nh_menuitem_conflict *)realloc(items,(long)local_25c * 0x10c);
  }
  pnVar1 = items + lVar10;
  pnVar1->id = L'\0';
  pnVar1->role = MI_TEXT;
  pnVar1->accel = '\0';
  pnVar1->group_accel = '\0';
  pnVar1->selected = '\0';
  strcpy(pnVar1->caption,linebuf);
  lVar10 = lVar10 + 1;
  if (pcVar3 == (char *)0x0) {
    sVar5 = strlen(__s);
    __s = __s + sVar5;
  }
  else {
    __s = pcVar3 + 1;
  }
  goto LAB_0011719f;
}

Assistant:

void curses_display_buffer(const char *inbuf, nh_bool trymove)
{
    char *line, *line_end, *buf;
    char linebuf[BUFSZ];
    int icount, size;
    struct nh_menuitem *items;

    buf = strdup(inbuf);
    icount = 0;
    size = 10;
    items = malloc(size * sizeof(struct nh_menuitem));

    line = buf;
    while (*line) {
	line_end = strchr(line, '\n');
	if (line_end) {
	    /* deal with the CR that Windows adds to the LF */
	    if (line_end > line && *(line_end - 1) == '\r')
		*(line_end - 1) = '\0';
	    *line_end = '\0';
	}

	strncpy(linebuf, line, BUFSZ);
	linebuf[BUFSZ - 1] = '\0';
	if (strchr(linebuf, '\t') != 0)
	    tabexpand(linebuf);
	add_menu_txt(items, size, icount, linebuf, MI_TEXT);

	if (line_end) {
	    line = line_end + 1;
	} else {
	    /* null terminator guaranteed if earlier strdup() succeeded */
	    line = strchr(line, '\0');
	}
    }

    curses_display_menu(items, icount, NULL, PICK_NONE, NULL);
    free(items);
    free(buf);
}